

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O1

int run_test_tcp_create_early_accept(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_tcp_t client;
  uv_tcp_t server;
  uv_connect_t connect_req;
  undefined1 auStack_268 [16];
  undefined1 local_258 [248];
  char local_160 [248];
  char local_68 [96];
  
  pcVar2 = (char *)uv_default_loop();
  pcVar4 = "0.0.0.0";
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_258);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(pcVar2,local_160);
    pcVar4 = pcVar2;
    if (iVar1 != 0) goto LAB_001728ee;
    pcVar4 = local_160;
    iVar1 = uv_tcp_bind(pcVar4,local_258,0);
    if (iVar1 != 0) goto LAB_001728f3;
    pcVar4 = local_160;
    iVar1 = uv_listen(pcVar4,0x80,on_connection);
    if (iVar1 != 0) goto LAB_001728f8;
    pcVar2 = (char *)uv_default_loop();
    pcVar4 = "127.0.0.1";
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_268);
    if (iVar1 != 0) goto LAB_001728fd;
    iVar1 = uv_tcp_init(pcVar2,local_258);
    if (iVar1 != 0) goto LAB_00172902;
    pcVar2 = local_68;
    iVar1 = uv_tcp_connect(pcVar2,local_258,auStack_268,on_connect);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      pcVar2 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017290c;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_001728ee:
    run_test_tcp_create_early_accept_cold_2();
LAB_001728f3:
    run_test_tcp_create_early_accept_cold_3();
LAB_001728f8:
    run_test_tcp_create_early_accept_cold_4();
LAB_001728fd:
    pcVar2 = pcVar4;
    run_test_tcp_create_early_accept_cold_5();
LAB_00172902:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_0017290c:
  run_test_tcp_create_early_accept_cold_8();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_create_early_accept) {
  uv_tcp_t client, server;
  uv_connect_t connect_req;

  tcp_listener(uv_default_loop(), &server);
  tcp_connector(uv_default_loop(), &client, &connect_req);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}